

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall
wasm::TranslateToFuzzReader::pickPasses(TranslateToFuzzReader *this,OptimizationOptions *options)

{
  Random *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  *this_01;
  uint32_t uVar2;
  long lVar3;
  PassInfo local_88;
  
  this_00 = &this->random;
  uVar2 = Random::upTo(this_00,2);
  if (uVar2 == 0) {
    local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"enclose-world","");
    local_88.argument.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int>._M_engaged = false;
    local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int>._M_engaged = false;
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>
              ((vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(options + 0x188),&local_88);
    if ((local_88.argument.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_engaged == true) &&
       (local_88.argument.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false,
       local_88.argument.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_dataplus._M_p !=
       ((pointer)
       ((long)&local_88.argument.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       + 0x10U))._M_p)) {
      operator_delete((void *)local_88.argument.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      local_88.argument.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
      operator_delete(local_88.name._M_dataplus._M_p,local_88.name.field_2._M_allocated_capacity + 1
                     );
    }
  }
  this_01 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
             *)(options + 0x188);
  lVar3 = *(long *)(options + 400) - *(long *)(options + 0x188);
  do {
    if (((0x13 < (ulong)((lVar3 >> 3) * 0x2e8ba2e8ba2e8ba3)) ||
        ((this->random).finishedInput != false)) || (uVar2 = Random::upTo(this_00,3), uVar2 == 0)) {
      uVar2 = Random::upTo(this_00,2);
      if (uVar2 == 0) {
        uVar2 = Random::upTo(this_00,4);
        *(uint32_t *)(options + 0xbc) = uVar2;
        uVar2 = Random::upTo(this_00,3);
        *(uint32_t *)(options + 0xc0) = uVar2;
      }
      if ((options[0xdd] == (OptimizationOptions)0x0) &&
         (uVar2 = Random::upTo(this_00,2), uVar2 == 0)) {
        options[0xdd] = (OptimizationOptions)0x1;
      }
      uVar2 = Random::upTo(this_00,2);
      if (uVar2 == 0) {
        paVar1 = &local_88.name.field_2;
        local_88.name._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"legalize-and-prune-js-interface","");
        local_88.argument.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
        local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged = false;
        local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged = false;
        std::
        vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
        ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
        if ((local_88.argument.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged == true) &&
           (local_88.argument.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged = false,
           local_88.argument.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_dataplus._M_p !=
           ((pointer)
           ((long)&local_88.argument.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           + 0x10U))._M_p)) {
          operator_delete((void *)local_88.argument.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          local_88.argument.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_88.name._M_dataplus._M_p,
                          local_88.name.field_2._M_allocated_capacity + 1);
        }
      }
      if ((((byte)this->wasm[0x179] & 4) != 0) && (uVar2 = Random::upTo(this_00,10), uVar2 != 0)) {
        paVar1 = &local_88.name.field_2;
        local_88.name._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"dce","");
        local_88.argument.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
        local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged = false;
        local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged = false;
        std::
        vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
        ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
        if ((local_88.argument.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged == true) &&
           (local_88.argument.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged = false,
           local_88.argument.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_dataplus._M_p !=
           ((pointer)
           ((long)&local_88.argument.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           + 0x10U))._M_p)) {
          operator_delete((void *)local_88.argument.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          local_88.argument.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_88.name._M_dataplus._M_p,
                          local_88.name.field_2._M_allocated_capacity + 1);
        }
      }
      return;
    }
    uVar2 = Random::upTo(this_00,0x2a);
    switch(uVar2) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
      uVar2 = Random::upTo(this_00,4);
      *(uint32_t *)(options + 0xbc) = uVar2;
      uVar2 = Random::upTo(this_00,3);
      *(uint32_t *)(options + 0xc0) = uVar2;
      OptimizationOptions::addDefaultOptPasses(options);
      goto LAB_00123dc8;
    case 5:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"coalesce-locals","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 6:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"code-pushing","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 7:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"code-folding","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 8:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"dce","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 9:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"duplicate-function-elimination","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 10:
      if ((*(ushort *)(this->wasm + 0x178) & 0x540) == 0) {
        local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"flatten","");
        local_88.argument.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
        local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged = false;
        local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged = false;
        std::
        vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
        ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
        if ((local_88.argument.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged == true) &&
           (local_88.argument.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged = false,
           local_88.argument.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_dataplus._M_p !=
           ((pointer)
           ((long)&local_88.argument.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           + 0x10U))._M_p)) {
          operator_delete((void *)local_88.argument.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          local_88.argument.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
          operator_delete(local_88.name._M_dataplus._M_p,
                          local_88.name.field_2._M_allocated_capacity + 1);
        }
        uVar2 = Random::upTo(this_00,2);
        if (uVar2 == 0) {
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"rereloop","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          OptimizationOptions::PassInfo::~PassInfo(&local_88);
        }
      }
      goto LAB_00123dc8;
    case 0xb:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"inlining","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0xc:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"inlining-optimizing","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0xd:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"local-cse","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0xe:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"memory-packing","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0xf:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"merge-blocks","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x10:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"optimize-instructions","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x11:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"pick-load-signs","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x12:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"precompute","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x13:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"precompute-propagate","")
      ;
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x14:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"remove-unused-brs","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x15:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"remove-unused-module-elements","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x16:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"remove-unused-names","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x17:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"reorder-functions","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x18:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"reorder-locals","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x19:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"directize","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x1a:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"simplify-locals","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x1b:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"simplify-locals-notee","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x1c:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"simplify-locals-nostructure","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x1d:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"simplify-locals-notee-nostructure","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x1e:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"ssa","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x1f:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"vacuum","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x20:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"merge-locals","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x21:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"licm","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x22:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"tuple-optimization","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x23:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"rse","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x24:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"monomorphize","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x25:
      local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"monomorphize-always","");
      local_88.argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
      if (((byte)this->wasm[0x179] & 4) != 0) {
        options[0xdd] = (OptimizationOptions)0x1;
        this->closedWorld = true;
        uVar2 = Random::upTo(this_00,0x10);
        switch(uVar2) {
        case 0:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"abstract-type-refining","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 1:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"cfp","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 2:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"gsi","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 3:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"gto","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 4:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"heap2local","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 5:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"heap-store-optimization","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 6:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"minimize-rec-groups","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 7:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"remove-unused-types","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 8:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"signature-pruning","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 9:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"signature-refining","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 10:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"type-finalizing","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 0xb:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"type-refining","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 0xc:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"type-merging","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 0xd:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"type-ssa","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 0xe:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"type-unfinalizing","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        case 0xf:
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unsubtyping","");
          local_88.argument.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          local_88.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          local_88.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = false;
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::emplace_back<wasm::OptimizationOptions::PassInfo>(this_01,&local_88);
          break;
        default:
          wasm::handle_unreachable
                    ("unexpected value",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,299);
        }
        break;
      }
      goto LAB_00123dc8;
    default:
      wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x130);
    }
    if ((local_88.argument.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_engaged == true) &&
       (local_88.argument.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false,
       local_88.argument.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_dataplus._M_p !=
       ((pointer)
       ((long)&local_88.argument.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       + 0x10U))._M_p)) {
      operator_delete((void *)local_88.argument.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      local_88.argument.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
      operator_delete(local_88.name._M_dataplus._M_p,local_88.name.field_2._M_allocated_capacity + 1
                     );
    }
LAB_00123dc8:
    lVar3 = *(long *)(options + 400) - *(long *)(options + 0x188);
  } while( true );
}

Assistant:

void TranslateToFuzzReader::pickPasses(OptimizationOptions& options) {
  // Pick random passes to further shape the wasm. This is similar to how we
  // pick random passes in fuzz_opt.py, but the goal there is to find problems
  // in the passes, while the goal here is more to shape the wasm, so that
  // translate-to-fuzz emits interesting outputs (the latter is important for
  // things like ClusterFuzz, where we are using Binaryen to fuzz other things
  // than itself). As a result, the list of passes here is different from
  // fuzz_opt.py.

  // Enclose the world, some of the time. We do this before picking any other
  // passes so that we make the initial fuzz contents more optimizable by
  // closed-world passes later. Note that we do this regardless of whether we
  // are in closed-world mode or not, as it is good to get this variety
  // regardless.
  if (oneIn(2)) {
    options.passes.push_back("enclose-world");
  }

  // Main selection of passes.
  while (options.passes.size() < 20 && !random.finished() && !oneIn(3)) {
    switch (upTo(42)) {
      case 0:
      case 1:
      case 2:
      case 3:
      case 4: {
        options.passOptions.optimizeLevel = upTo(4);
        options.passOptions.shrinkLevel = upTo(3);
        options.addDefaultOptPasses();
        break;
      }
      case 5:
        options.passes.push_back("coalesce-locals");
        break;
      case 6:
        options.passes.push_back("code-pushing");
        break;
      case 7:
        options.passes.push_back("code-folding");
        break;
      case 8:
        options.passes.push_back("dce");
        break;
      case 9:
        options.passes.push_back("duplicate-function-elimination");
        break;
      case 10:
        // Some features do not support flatten yet.
        if (!wasm.features.hasReferenceTypes() &&
            !wasm.features.hasExceptionHandling() && !wasm.features.hasGC()) {
          options.passes.push_back("flatten");
          if (oneIn(2)) {
            options.passes.push_back("rereloop");
          }
        }
        break;
      case 11:
        options.passes.push_back("inlining");
        break;
      case 12:
        options.passes.push_back("inlining-optimizing");
        break;
      case 13:
        options.passes.push_back("local-cse");
        break;
      case 14:
        options.passes.push_back("memory-packing");
        break;
      case 15:
        options.passes.push_back("merge-blocks");
        break;
      case 16:
        options.passes.push_back("optimize-instructions");
        break;
      case 17:
        options.passes.push_back("pick-load-signs");
        break;
      case 18:
        options.passes.push_back("precompute");
        break;
      case 19:
        options.passes.push_back("precompute-propagate");
        break;
      case 20:
        options.passes.push_back("remove-unused-brs");
        break;
      case 21:
        options.passes.push_back("remove-unused-module-elements");
        break;
      case 22:
        options.passes.push_back("remove-unused-names");
        break;
      case 23:
        options.passes.push_back("reorder-functions");
        break;
      case 24:
        options.passes.push_back("reorder-locals");
        break;
      case 25:
        options.passes.push_back("directize");
        break;
      case 26:
        options.passes.push_back("simplify-locals");
        break;
      case 27:
        options.passes.push_back("simplify-locals-notee");
        break;
      case 28:
        options.passes.push_back("simplify-locals-nostructure");
        break;
      case 29:
        options.passes.push_back("simplify-locals-notee-nostructure");
        break;
      case 30:
        options.passes.push_back("ssa");
        break;
      case 31:
        options.passes.push_back("vacuum");
        break;
      case 32:
        options.passes.push_back("merge-locals");
        break;
      case 33:
        options.passes.push_back("licm");
        break;
      case 34:
        options.passes.push_back("tuple-optimization");
        break;
      case 35:
        options.passes.push_back("rse");
        break;
      case 36:
        options.passes.push_back("monomorphize");
        break;
      case 37:
        options.passes.push_back("monomorphize-always");
        break;
      case 38:
      case 39:
      case 40:
      case 41:
        // GC specific passes.
        if (wasm.features.hasGC()) {
          // Most of these depend on closed world, so just set that. Set it both
          // on the global pass options, and in the internal state of this
          // TranslateToFuzzReader instance.
          options.passOptions.closedWorld = true;
          closedWorld = true;

          switch (upTo(16)) {
            case 0:
              options.passes.push_back("abstract-type-refining");
              break;
            case 1:
              options.passes.push_back("cfp");
              break;
            case 2:
              options.passes.push_back("gsi");
              break;
            case 3:
              options.passes.push_back("gto");
              break;
            case 4:
              options.passes.push_back("heap2local");
              break;
            case 5:
              options.passes.push_back("heap-store-optimization");
              break;
            case 6:
              options.passes.push_back("minimize-rec-groups");
              break;
            case 7:
              options.passes.push_back("remove-unused-types");
              break;
            case 8:
              options.passes.push_back("signature-pruning");
              break;
            case 9:
              options.passes.push_back("signature-refining");
              break;
            case 10:
              options.passes.push_back("type-finalizing");
              break;
            case 11:
              options.passes.push_back("type-refining");
              break;
            case 12:
              options.passes.push_back("type-merging");
              break;
            case 13:
              options.passes.push_back("type-ssa");
              break;
            case 14:
              options.passes.push_back("type-unfinalizing");
              break;
            case 15:
              options.passes.push_back("unsubtyping");
              break;
            default:
              WASM_UNREACHABLE("unexpected value");
          }
        }
        break;
      default:
        WASM_UNREACHABLE("unexpected value");
    }
  }

  if (oneIn(2)) {
    // We randomize these when we pick -O?, but sometimes do so even without, as
    // they affect some passes.
    options.passOptions.optimizeLevel = upTo(4);
    options.passOptions.shrinkLevel = upTo(3);
  }

  if (!options.passOptions.closedWorld && oneIn(2)) {
    options.passOptions.closedWorld = true;
  }

  // Prune things that error in JS if we call them (like SIMD), some of the
  // time. This alters the wasm/JS boundary quite a lot, so testing both forms
  // is useful.
  if (oneIn(2)) {
    options.passes.push_back("legalize-and-prune-js-interface");
  }

  // Usually DCE at the very end, to ensure that our binaries validate in other
  // VMs, due to how non-nullable local validation and unreachable code
  // interact. See fuzz_opt.py and
  //   https://github.com/WebAssembly/binaryen/pull/5665
  //   https://github.com/WebAssembly/binaryen/issues/5599
  if (wasm.features.hasGC() && !oneIn(10)) {
    options.passes.push_back("dce");
  }

  // TODO: We could in theory run some function-level passes on particular
  //       functions, but then we'd need to do this after generation, not
  //       before (and random data no longer remains then).
}